

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

void printOptionValues(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  TidyOptionId optId;
  TidyConfigCategory TVar1;
  TidyIterator in_RAX;
  ctmbstr ptVar2;
  TidyIterator p_Var3;
  TidyIterator pos;
  TidyIterator local_38;
  
  local_38 = in_RAX;
  optId = tidyOptGetId(topt);
  TVar1 = tidyOptGetCategory(topt);
  if (TVar1 != TidyInternalCategory) {
    if ((optId - TidyBlockTags < 0x3d) &&
       ((0x1000000400010001U >> ((ulong)(optId - TidyBlockTags) & 0x3f) & 1) != 0)) {
      local_38 = tidyOptGetDeclTagList(tdoc);
      p_Var3 = local_38;
      while (p_Var3 != (TidyIterator)0x0) {
        ptVar2 = tidyOptGetNextDeclTag(tdoc,optId,&local_38);
        d->def = ptVar2;
        p_Var3 = (TidyIterator)0x0;
        if (local_38 != (TidyIterator)0x0) {
          printf("%-27.27s %-9.9s  %-40.40s\n",d->name,d->type,ptVar2);
          d->name = "";
          d->type = "";
          p_Var3 = local_38;
        }
      }
    }
    if (((*d->name != '\0') || (*d->type != '\0')) || ((d->def != (char *)0x0 && (*d->def != '\0')))
       ) {
      if (d->def == (ctmbstr)0x0) {
        d->def = "";
      }
      printf("%-27.27s %-9.9s  %-40.40s\n",d->name,d->type);
    }
  }
  return;
}

Assistant:

static void printOptionValues(TidyDoc ARG_UNUSED(tdoc),  /**< The Tidy document. */
                              TidyOption topt,           /**< The option for which to show values. */
                              OptionDesc *d              /**< The OptionDesc array. */
                              )
{
    TidyOptionId optId = tidyOptGetId( topt );

    if ( tidyOptGetCategory(topt) == TidyInternalCategory )
        return;

    switch ( optId )
    {
        case TidyInlineTags:
        case TidyBlockTags:
        case TidyEmptyTags:
        case TidyPreTags:
        {
            TidyIterator pos = tidyOptGetDeclTagList( tdoc );
            while ( pos )
            {
                d->def = tidyOptGetNextDeclTag(tdoc, optId, &pos);
                if ( pos )
                {
                    printf( fmt, d->name, d->type, d->def );
                    d->name = "";
                    d->type = "";
                }
            }
        }
            break;
        default:
            break;
    }

    /* fix for http://tidy.sf.net/bug/873921 */
    if ( *d->name || *d->type || (d->def && *d->def) )
    {
        if ( ! d->def )
            d->def = "";
        printf( fmt, d->name, d->type, d->def );
    }
}